

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Line_AlignCeiling
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  int linenum;
  int line;
  FLineIdIterator itr;
  bool ret;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr.searchtag._3_1_ = 0;
  itr.start = arg2;
  FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffcc,arg0);
  while( true ) {
    linenum = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffcc);
    if (linenum < 0) break;
    bVar1 = P_AlignFlat(linenum,(uint)(arg1 != 0),1);
    itr.searchtag._3_1_ = (itr.searchtag._3_1_ & 1) != 0 || bVar1;
  }
  return (int)(itr.searchtag._3_1_ & 1);
}

Assistant:

FUNC(LS_Line_AlignCeiling)
// Line_AlignCeiling (lineid, side)
{
	bool ret = 0;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		ret |= P_AlignFlat (line, !!arg1, 1);
	}
	return ret;
}